

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall TestValueTestzeroesInKeys::runTestCase(TestValueTestzeroesInKeys *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestResult *pTVar2;
  bool bVar3;
  Value *pVVar4;
  string binary;
  Value removed;
  Value root;
  ValueHolder local_130 [2];
  undefined1 local_120 [24];
  string local_108;
  string local_e8;
  ValueHolder local_c8 [2];
  undefined1 local_b8 [24];
  Value local_a0;
  string local_78;
  Value local_58;
  
  local_e8.field_2._M_allocated_capacity._0_4_ = 0x690068;
  local_e8._M_string_length = 4;
  local_e8.field_2._M_local_buf[4] = '\0';
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  JsonTest::checkEqual<unsigned_int,unsigned_long>
            ((this->super_ValueTest).super_TestCase.result_,4,4,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x684,"4U == binary.length()");
  Json::Value::Value(&local_a0,nullValue);
  Json::Value::Value(&local_58,"there");
  pVVar4 = Json::Value::operator[](&local_a0,&local_e8);
  Json::Value::operator=(pVVar4,&local_58);
  Json::Value::~Value(&local_58);
  pTVar2 = (this->super_ValueTest).super_TestCase.result_;
  local_c8[0].string_ = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"there","");
  pVVar4 = Json::Value::operator[](&local_a0,&local_e8);
  Json::Value::asString_abi_cxx11_((string *)local_130,pVVar4);
  JsonTest::checkStringEqual
            (pTVar2,(string *)local_c8,(string *)local_130,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x688,"\"there\" == root[binary].asString()");
  if (local_130[0] != local_120) {
    operator_delete(local_130[0].string_);
  }
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0].string_);
  }
  bVar3 = Json::Value::isMember(&local_a0,"h");
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x689,"!root.isMember(\"h\")");
  }
  bVar3 = Json::Value::isMember(&local_a0,&local_e8);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x68a,"root.isMember(binary)");
  }
  pTVar2 = (this->super_ValueTest).super_TestCase.result_;
  local_130[0].string_ = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"there","");
  Json::Value::get((Value *)local_c8,&local_a0,&local_e8,(Value *)Json::kNull);
  Json::Value::asString_abi_cxx11_(&local_108,(Value *)local_c8);
  JsonTest::checkStringEqual
            (pTVar2,(string *)local_130,&local_108,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x68b,"\"there\" == root.get(binary, Json::Value::nullRef).asString()");
  paVar1 = &local_108.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  Json::Value::~Value((Value *)local_c8);
  if (local_130[0] != local_120) {
    operator_delete(local_130[0].string_);
  }
  Json::Value::Value((Value *)local_c8,nullValue);
  bVar3 = Json::Value::removeMember
                    (&local_a0,local_e8._M_dataplus._M_p,
                     local_e8._M_dataplus._M_p + local_e8._M_string_length,(Value *)local_c8);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x690,"did");
  }
  pTVar2 = (this->super_ValueTest).super_TestCase.result_;
  local_130[0].string_ = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"there","");
  Json::Value::asString_abi_cxx11_(&local_108,(Value *)local_c8);
  JsonTest::checkStringEqual
            (pTVar2,(string *)local_130,&local_108,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x691,"\"there\" == removed.asString()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if (local_130[0] != local_120) {
    operator_delete(local_130[0].string_);
  }
  bVar3 = Json::Value::removeMember
                    (&local_a0,local_e8._M_dataplus._M_p,
                     local_e8._M_dataplus._M_p + local_e8._M_string_length,(Value *)local_c8);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x694,"!did");
  }
  pTVar2 = (this->super_ValueTest).super_TestCase.result_;
  local_130[0].string_ = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"there","");
  Json::Value::asString_abi_cxx11_(&local_108,(Value *)local_c8);
  JsonTest::checkStringEqual
            (pTVar2,(string *)local_130,&local_108,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x695,"\"there\" == removed.asString()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if (local_130[0] != local_120) {
    operator_delete(local_130[0].string_);
  }
  bVar3 = Json::Value::isMember(&local_a0,&local_e8);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x696,"!root.isMember(binary)");
  }
  pTVar2 = (this->super_ValueTest).super_TestCase.result_;
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
  Json::Value::get((Value *)local_130,&local_a0,&local_e8,(Value *)Json::kNull);
  Json::Value::asString_abi_cxx11_(&local_78,(Value *)local_130);
  JsonTest::checkStringEqual
            (pTVar2,&local_108,&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x697,"\"\" == root.get(binary, Json::Value::nullRef).asString()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  Json::Value::~Value((Value *)local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  Json::Value::~Value((Value *)local_c8);
  Json::Value::~Value(&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, zeroesInKeys) {
  char const cstr[] = "h\0i";
  std::string binary(cstr, sizeof(cstr));  // include trailing 0
  JSONTEST_ASSERT_EQUAL(4U, binary.length());
  {
    Json::Value root;
    root[binary] = "there";
    JSONTEST_ASSERT_STRING_EQUAL("there", root[binary].asString());
    JSONTEST_ASSERT(!root.isMember("h"));
    JSONTEST_ASSERT(root.isMember(binary));
    JSONTEST_ASSERT_STRING_EQUAL("there", root.get(binary, Json::Value::nullRef).asString());
    Json::Value removed;
    bool did;
    did = root.removeMember(binary.data(), binary.data() + binary.length(),
        &removed);
    JSONTEST_ASSERT(did);
    JSONTEST_ASSERT_STRING_EQUAL("there", removed.asString());
    did = root.removeMember(binary.data(), binary.data() + binary.length(),
        &removed);
    JSONTEST_ASSERT(!did);
    JSONTEST_ASSERT_STRING_EQUAL("there", removed.asString()); // still
    JSONTEST_ASSERT(!root.isMember(binary));
    JSONTEST_ASSERT_STRING_EQUAL("", root.get(binary, Json::Value::nullRef).asString());
  }
}